

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_prune.cpp
# Opt level: O1

void __thiscall
PruneReplayer::access_raytracing_pipeline
          (PruneReplayer *this,Hash hash,VkRayTracingPipelineCreateInfoKHR *create_info)

{
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  *this_00;
  VkPipeline pVVar1;
  ulong uVar2;
  __node_base_ptr p_Var3;
  size_type sVar4;
  VkPipelineLibraryCreateInfoKHR *pVVar5;
  __node_base_ptr p_Var6;
  _Hash_node_base *p_Var7;
  ulong uVar8;
  long lVar9;
  __node_base_ptr p_Var10;
  ulong uVar11;
  __hashtable *__h;
  __node_gen_type __node_gen;
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *local_48;
  undefined8 local_40;
  Hash local_38;
  
  this_00 = &this->accessed_raytracing_pipelines;
  local_38 = hash;
  sVar4 = std::
          _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::count(&this_00->_M_h,&local_38);
  if (sVar4 == 0) {
    local_48 = &this_00->_M_h;
    std::
    _Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
    ::
    _M_insert<unsigned_long_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_long,false>>>>
              ((_Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                *)this_00,&local_38);
    access_pipeline_layout(this,(Hash)create_info->layout);
    if (create_info->stageCount != 0) {
      lVar9 = 0x18;
      uVar11 = 0;
      do {
        local_40 = *(undefined8 *)((long)&create_info->pStages->sType + lVar9);
        local_48 = &(this->accessed_shader_modules)._M_h;
        std::
        _Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
        ::
        _M_insert<unsigned_long,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_long,false>>>>
                  ((_Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                    *)&this->accessed_shader_modules,&local_40,&local_48);
        uVar11 = uVar11 + 1;
        lVar9 = lVar9 + 0x30;
      } while (uVar11 < create_info->stageCount);
    }
    if ((create_info->pLibraryInfo != (VkPipelineLibraryCreateInfoKHR *)0x0) &&
       (pVVar5 = create_info->pLibraryInfo, pVVar5->libraryCount != 0)) {
      uVar11 = 0;
      do {
        pVVar1 = pVVar5->pLibraries[uVar11];
        uVar2 = (this->library_raytracing_pipelines)._M_h._M_bucket_count;
        uVar8 = (ulong)pVVar1 % uVar2;
        p_Var3 = (this->library_raytracing_pipelines)._M_h._M_buckets[uVar8];
        p_Var6 = (__node_base_ptr)0x0;
        if ((p_Var3 != (__node_base_ptr)0x0) &&
           (p_Var6 = p_Var3, p_Var10 = p_Var3->_M_nxt,
           (VkPipeline)p_Var3->_M_nxt[1]._M_nxt != pVVar1)) {
          while (p_Var7 = p_Var10->_M_nxt, p_Var7 != (_Hash_node_base *)0x0) {
            p_Var6 = (__node_base_ptr)0x0;
            if (((ulong)p_Var7[1]._M_nxt % uVar2 != uVar8) ||
               (p_Var6 = p_Var10, p_Var10 = p_Var7, (VkPipeline)p_Var7[1]._M_nxt == pVVar1))
            goto LAB_0011335d;
          }
          p_Var6 = (__node_base_ptr)0x0;
        }
LAB_0011335d:
        if (p_Var6 == (__node_base_ptr)0x0) {
          p_Var7 = (_Hash_node_base *)0x0;
        }
        else {
          p_Var7 = p_Var6->_M_nxt;
        }
        if (p_Var7 != (_Hash_node_base *)0x0) {
          access_raytracing_pipeline
                    (this,(Hash)p_Var7[1]._M_nxt,
                     (VkRayTracingPipelineCreateInfoKHR *)p_Var7[2]._M_nxt);
        }
        uVar11 = uVar11 + 1;
        pVVar5 = create_info->pLibraryInfo;
      } while (uVar11 < pVVar5->libraryCount);
    }
  }
  return;
}

Assistant:

void access_raytracing_pipeline(Hash hash, const VkRayTracingPipelineCreateInfoKHR *create_info)
	{
		if (accessed_raytracing_pipelines.count(hash))
			return;
		accessed_raytracing_pipelines.insert(hash);

		access_pipeline_layout((Hash) create_info->layout);
		for (uint32_t stage = 0; stage < create_info->stageCount; stage++)
			accessed_shader_modules.insert((Hash) create_info->pStages[stage].module);

		if (create_info->pLibraryInfo)
		{
			for (uint32_t i = 0; i < create_info->pLibraryInfo->libraryCount; i++)
			{
				// Only need to recurse if a pipeline was only allowed due to having CREATE_LIBRARY_KHR flag.
				auto lib_itr = library_raytracing_pipelines.find((Hash) create_info->pLibraryInfo->pLibraries[i]);
				if (lib_itr != library_raytracing_pipelines.end())
					access_raytracing_pipeline(lib_itr->first, lib_itr->second);
			}
		}
	}